

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O2

void __thiscall KmerList::uniq(KmerList *this)

{
  undefined8 uVar1;
  KMerNodeFreq_s *pKVar2;
  KMerNodeFreq_s *pKVar3;
  KMerNodeFreq_s *pKVar4;
  KMerNodeFreq_s *pKVar5;
  uint8_t uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  
  pKVar2 = this->kmers;
  pKVar3 = pKVar2 + this->size;
  pKVar4 = pKVar2;
  while (pKVar4 < pKVar3) {
    pKVar2->count = pKVar4->count;
    uVar1 = *(undefined8 *)((long)&pKVar4->kdata + 8);
    *(long *)&pKVar2->kdata = (long)pKVar4->kdata;
    *(undefined8 *)((long)&pKVar2->kdata + 8) = uVar1;
    pKVar5 = pKVar4;
    while ((pKVar4 = pKVar5 + 1, pKVar4 < pKVar3 &&
           (auVar8[0] = -((char)pKVar4->kdata == (char)pKVar2->kdata),
           auVar8[1] = -(*(char *)((long)&pKVar5[1].kdata + 1) ==
                        *(char *)((long)&pKVar2->kdata + 1)),
           auVar8[2] = -(*(char *)((long)&pKVar5[1].kdata + 2) ==
                        *(char *)((long)&pKVar2->kdata + 2)),
           auVar8[3] = -(*(char *)((long)&pKVar5[1].kdata + 3) ==
                        *(char *)((long)&pKVar2->kdata + 3)),
           auVar8[4] = -(*(char *)((long)&pKVar5[1].kdata + 4) ==
                        *(char *)((long)&pKVar2->kdata + 4)),
           auVar8[5] = -(*(char *)((long)&pKVar5[1].kdata + 5) ==
                        *(char *)((long)&pKVar2->kdata + 5)),
           auVar8[6] = -(*(char *)((long)&pKVar5[1].kdata + 6) ==
                        *(char *)((long)&pKVar2->kdata + 6)),
           auVar8[7] = -(*(char *)((long)&pKVar5[1].kdata + 7) ==
                        *(char *)((long)&pKVar2->kdata + 7)),
           auVar8[8] = -(*(char *)((long)&pKVar5[1].kdata + 8) ==
                        *(char *)((long)&pKVar2->kdata + 8)),
           auVar8[9] = -(*(char *)((long)&pKVar5[1].kdata + 9) ==
                        *(char *)((long)&pKVar2->kdata + 9)),
           auVar8[10] = -(*(char *)((long)&pKVar5[1].kdata + 10) ==
                         *(char *)((long)&pKVar2->kdata + 10)),
           auVar8[0xb] = -(*(char *)((long)&pKVar5[1].kdata + 0xb) ==
                          *(char *)((long)&pKVar2->kdata + 0xb)),
           auVar8[0xc] = -(*(char *)((long)&pKVar5[1].kdata + 0xc) ==
                          *(char *)((long)&pKVar2->kdata + 0xc)),
           auVar8[0xd] = -(*(char *)((long)&pKVar5[1].kdata + 0xd) ==
                          *(char *)((long)&pKVar2->kdata + 0xd)),
           auVar8[0xe] = -(*(char *)((long)&pKVar5[1].kdata + 0xe) ==
                          *(char *)((long)&pKVar2->kdata + 0xe)),
           auVar8[0xf] = -(*(char *)((long)&pKVar5[1].kdata + 0xf) ==
                          *(char *)((long)&pKVar2->kdata + 0xf)),
           (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff))) {
      uVar7 = (uint)pKVar5[1].count + (uint)pKVar2->count;
      uVar6 = (uint8_t)uVar7;
      if (0xfe < uVar7) {
        uVar6 = 0xff;
      }
      pKVar2->count = uVar6;
      pKVar5 = pKVar4;
    }
    pKVar2 = pKVar2 + 1;
  }
  resize(this,((long)pKVar2 - (long)this->kmers) / 0x11);
  return;
}

Assistant:

void KmerList::uniq() {
    auto wptr = kmers;
    auto endptr = kmers + size;
    for (auto rptr = kmers; rptr < endptr; ++wptr) {
        *wptr = *rptr;
        ++rptr;
        while (rptr < endptr and *wptr == *rptr) {
            wptr->combine(*rptr);
            ++rptr;
        }
    }
    resize(wptr - kmers);
}